

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowImpl.cpp
# Opt level: O0

void __thiscall sf::priv::WindowImpl::WindowImpl(WindowImpl *this)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  JoystickManager *this_00;
  JoystickState *pJVar9;
  Vector3<float> *__n;
  NonCopyable *in_RDI;
  uint i_1;
  uint i;
  JoystickManager *in_stack_000000f0;
  JoystickState *in_stack_ffffffffffffff80;
  Vector3<float> *this_01;
  Vector3<float> *__first;
  NonCopyable *local_48;
  Vector3<float> local_2c;
  uint local_20;
  undefined4 local_1c;
  uint local_18;
  
  NonCopyable::NonCopyable(in_RDI);
  *(undefined ***)in_RDI = &PTR__WindowImpl_001d7ac8;
  std::queue<sf::Event,std::deque<sf::Event,std::allocator<sf::Event>>>::
  queue<std::deque<sf::Event,std::allocator<sf::Event>>,void>
            ((queue<sf::Event,_std::deque<sf::Event,_std::allocator<sf::Event>_>_> *)
             in_stack_ffffffffffffff80);
  local_48 = in_RDI + 0x58;
  do {
    JoystickState::JoystickState(in_stack_ffffffffffffff80);
    local_48 = local_48 + 0x44;
  } while (local_48 != in_RDI + 0x278);
  __n = (Vector3<float> *)(in_RDI + 0x2c0);
  __first = (Vector3<float> *)(in_RDI + 0x278);
  do {
    this_01 = __first;
    Vector3<float>::Vector3(this_01);
    __first = this_01 + 1;
  } while (__first != __n);
  *(undefined4 *)(in_RDI + 0x2c0) = 0x3dcccccd;
  JoystickManager::getInstance();
  JoystickManager::update(in_stack_000000f0);
  for (local_18 = 0; local_18 < 8; local_18 = local_18 + 1) {
    this_00 = JoystickManager::getInstance();
    pJVar9 = JoystickManager::getState(this_00,local_18);
    lVar1 = (ulong)local_18 * 0x44;
    *(undefined4 *)(in_RDI + lVar1 + 0x98) = *(undefined4 *)(pJVar9->buttons + 0x1c);
    uVar2 = *(undefined8 *)pJVar9;
    uVar3 = *(undefined8 *)(pJVar9->axes + 1);
    uVar4 = *(undefined8 *)(pJVar9->axes + 3);
    uVar5 = *(undefined8 *)(pJVar9->axes + 5);
    uVar6 = *(undefined8 *)(pJVar9->axes + 7);
    uVar7 = *(undefined8 *)(pJVar9->buttons + 4);
    uVar8 = *(undefined8 *)(pJVar9->buttons + 0x14);
    *(undefined8 *)(in_RDI + lVar1 + 0x88) = *(undefined8 *)(pJVar9->buttons + 0xc);
    *(undefined8 *)(in_RDI + lVar1 + 0x88 + 8) = uVar8;
    *(undefined8 *)(in_RDI + lVar1 + 0x78) = uVar6;
    *(undefined8 *)(in_RDI + lVar1 + 0x78 + 8) = uVar7;
    *(undefined8 *)(in_RDI + lVar1 + 0x68) = uVar4;
    *(undefined8 *)(in_RDI + lVar1 + 0x68 + 8) = uVar5;
    *(undefined8 *)(in_RDI + lVar1 + 0x58) = uVar2;
    *(undefined8 *)(in_RDI + lVar1 + 0x58 + 8) = uVar3;
    local_1c = 0;
    std::fill_n<float*,unsigned_long,float>(&__first->x,(unsigned_long)__n,&this_01->x);
  }
  for (local_20 = 0; local_20 < 6; local_20 = local_20 + 1) {
    Vector3<float>::Vector3(&local_2c,0.0,0.0,0.0);
    *(undefined8 *)(in_RDI + (ulong)local_20 * 0xc + 0x278) = local_2c._0_8_;
    *(float *)(in_RDI + (ulong)local_20 * 0xc + 0x278 + 8) = local_2c.z;
  }
  return;
}

Assistant:

WindowImpl::WindowImpl() :
m_joystickThreshold(0.1f)
{
    // Get the initial joystick states
    JoystickManager::getInstance().update();
    for (unsigned int i = 0; i < Joystick::Count; ++i)
    {
        m_joystickStates[i] = JoystickManager::getInstance().getState(i);
        std::fill_n(m_previousAxes[i], static_cast<std::size_t>(Joystick::AxisCount), 0.f);
    }

    // Get the initial sensor states
    for (unsigned int i = 0; i < Sensor::Count; ++i)
        m_sensorValue[i] = Vector3f(0, 0, 0);
}